

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::GenStructObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  FieldDef *s;
  Namespace *current_namespace;
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  ulong uVar4;
  char *pcVar5;
  byte local_3e9;
  string local_3d0;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  EnumVal *local_250;
  EnumVal *val;
  EnumDef *enum_def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator<char> local_199;
  string local_198;
  undefined1 local_178 [8];
  string type_name;
  string defaultValue;
  string field_name;
  FieldDef *field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_108;
  const_iterator it;
  string constructor_args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string object_type;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  string *code;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  GenDocComment(&(struct_def->super_Definition).doc_comment,"",__return_storage_ptr__);
  IdlNamer::ObjectType_abi_cxx11_((string *)local_60,&this->namer_,struct_def);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&constructor_args.field_2 + 8),"class ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&constructor_args.field_2 + 8)," implements ");
  std::operator+(&local_a0,&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::operator+(&local_80,&local_a0,".Packable {\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)(constructor_args.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&it);
  local_108._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin(non_deprecated_fields);
  while( true ) {
    field = (FieldDef *)
            std::
            vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            ::end(non_deprecated_fields);
    bVar1 = __gnu_cxx::operator!=
                      (&local_108,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)&field);
    if (!bVar1) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_108);
    s = ppVar3->second;
    IdlNamer::Field_abi_cxx11_((string *)((long)&defaultValue.field_2 + 8),&this->namer_,s);
    getDefaultValue_abi_cxx11_((string *)((long)&type_name.field_2 + 8),this,&s->value);
    current_namespace = (struct_def->super_Definition).defined_namespace;
    uVar2 = std::__cxx11::string::empty();
    local_3e9 = 0;
    if ((uVar2 & 1) != 0) {
      local_3e9 = struct_def->fixed ^ 0xff;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"T",&local_199);
    GenDartTypeName((string *)local_178,this,&(s->value).type,current_namespace,s,
                    (bool)(local_3e9 & 1),&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    GenDocComment(&(s->super_Definition).doc_comment,"  ",__return_storage_ptr__);
    std::operator+(&local_220,"  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    std::operator+(&local_200,&local_220," ");
    std::operator+(&local_1e0,&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&defaultValue.field_2 + 8));
    std::operator+(&local_1c0,&local_1e0,";\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)&it,",\n");
    }
    std::__cxx11::string::operator+=((string *)&it,"      ");
    pcVar5 = "";
    if ((struct_def->fixed & 1U) != 0) {
      pcVar5 = "required ";
    }
    std::__cxx11::string::operator+=((string *)&it,pcVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&enum_def,
                   "this.",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&defaultValue.field_2 + 8));
    std::__cxx11::string::operator+=((string *)&it,(string *)&enum_def);
    std::__cxx11::string::~string((string *)&enum_def);
    if (((struct_def->fixed & 1U) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)
       ) {
      bVar1 = IsEnum(&(s->value).type);
      if (bVar1) {
        val = (EnumVal *)(s->value).type.enum_def;
        local_250 = EnumDef::FindByValue((EnumDef *)val,(string *)((long)&type_name.field_2 + 8));
        if (local_250 == (EnumVal *)0x0) {
          IdlNamer::Type_abi_cxx11_(&local_2f0,&this->namer_,(EnumDef *)val);
          std::operator+(&local_2d0," = ",&local_2f0);
          std::operator+(&local_2b0,&local_2d0,"._default");
          std::__cxx11::string::operator+=((string *)&it,(string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
        }
        else {
          IdlNamer::EnumVariant_abi_cxx11_(&local_290,&this->namer_,(EnumDef *)val,local_250);
          std::operator+(&local_270," = ",&local_290);
          std::__cxx11::string::operator+=((string *)&it,(string *)&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
        }
      }
      else {
        std::operator+(&local_310," = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&type_name.field_2 + 8));
        std::__cxx11::string::operator+=((string *)&it,(string *)&local_310);
        std::__cxx11::string::~string((string *)&local_310);
      }
    }
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)(type_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(defaultValue.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_108);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator+(&local_390,"\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::operator+(&local_370,&local_390,"({\n");
    std::operator+(&local_350,&local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
    std::operator+(&local_330,&local_350,"});\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
  }
  GenStructObjectAPIPack_abi_cxx11_(&local_3b0,this,struct_def,non_deprecated_fields);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  GenToString(&local_3d0,this,(string *)local_60,non_deprecated_fields);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}\n\n");
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string GenStructObjectAPI(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string code;
    GenDocComment(struct_def.doc_comment, "", code);

    std::string object_type = namer_.ObjectType(struct_def);
    code += "class " + object_type + " implements " + _kFb + ".Packable {\n";

    std::string constructor_args;
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const FieldDef &field = *it->second;

      const std::string field_name = namer_.Field(field);
      const std::string defaultValue = getDefaultValue(field.value);
      const std::string type_name =
          GenDartTypeName(field.value.type, struct_def.defined_namespace, field,
                          defaultValue.empty() && !struct_def.fixed, "T");

      GenDocComment(field.doc_comment, "  ", code);
      code += "  " + type_name + " " + field_name + ";\n";

      if (!constructor_args.empty()) constructor_args += ",\n";
      constructor_args += "      ";
      constructor_args += (struct_def.fixed ? "required " : "");
      constructor_args += "this." + field_name;
      if (!struct_def.fixed && !defaultValue.empty()) {
        if (IsEnum(field.value.type)) {
          auto &enum_def = *field.value.type.enum_def;
          if (auto val = enum_def.FindByValue(defaultValue)) {
            constructor_args += " = " + namer_.EnumVariant(enum_def, *val);
          } else {
            constructor_args += " = " + namer_.Type(enum_def) + "._default";
          }
        } else {
          constructor_args += " = " + defaultValue;
        }
      }
    }

    if (!constructor_args.empty()) {
      code += "\n  " + object_type + "({\n" + constructor_args + "});\n\n";
    }

    code += GenStructObjectAPIPack(struct_def, non_deprecated_fields);
    code += "\n";
    code += GenToString(object_type, non_deprecated_fields);

    code += "}\n\n";
    return code;
  }